

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

void google::protobuf::TextFormat::OutOfLinePrintString<int>
               (BaseTextGenerator *generator,int *values)

{
  Nonnull<char_*> pcVar1;
  long *local_70;
  undefined8 local_68;
  long local_60 [2];
  long local_50;
  Nonnull<char_*> local_48;
  char local_40 [32];
  
  pcVar1 = absl::lts_20250127::numbers_internal::FastIntToBuffer(*values,local_40);
  local_50 = (long)pcVar1 - (long)local_40;
  local_70 = local_60;
  local_48 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,local_40,pcVar1);
  (*generator->_vptr_BaseTextGenerator[5])(generator,local_70,local_68);
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  return;
}

Assistant:

PROTOBUF_NOINLINE void TextFormat::OutOfLinePrintString(
    BaseTextGenerator* generator, const T&... values) {
  generator->PrintString(absl::StrCat(values...));
}